

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum-dtoa.cc
# Opt level: O0

void double_conversion::InitialScaledStartValues
               (uint64_t significand,int exponent,bool lower_boundary_is_closer,int estimated_power,
               bool need_boundary_deltas,Bignum *numerator,Bignum *denominator,Bignum *delta_minus,
               Bignum *delta_plus)

{
  uint uVar1;
  int in_ECX;
  undefined1 in_DL;
  int in_ESI;
  Bignum *in_RDI;
  undefined1 in_R8B;
  uint64_t in_R9;
  Bignum *unaff_retaddr;
  Bignum *in_stack_00000008;
  Bignum *in_stack_00000010;
  int shift_amount;
  bool need_boundary_deltas_00;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined3 in_stack_ffffffffffffffe8;
  uint estimated_power_00;
  undefined3 in_stack_fffffffffffffff0;
  uint uVar2;
  
  uVar1 = CONCAT13(in_DL,in_stack_fffffffffffffff0);
  uVar2 = uVar1 & 0x1ffffff;
  estimated_power_00 = CONCAT13(in_R8B,in_stack_ffffffffffffffe8) & 0x1ffffff;
  need_boundary_deltas_00 = SUB81((ulong)numerator >> 0x38,0);
  if (in_ESI < 0) {
    if (in_ECX < 0) {
      InitialScaledStartValuesNegativeExponentNegativePower
                (CONCAT44(in_ESI,uVar1) & 0xffffffff01ffffff,in_ECX,estimated_power_00,
                 SUB81(in_R9 >> 0x38,0),
                 (Bignum *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),numerator,
                 unaff_retaddr,in_stack_00000008);
      shift_amount = (int)((ulong)in_stack_00000010 >> 0x20);
    }
    else {
      InitialScaledStartValuesNegativeExponentPositivePower
                (in_R9,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,need_boundary_deltas_00,
                 in_stack_00000010,(Bignum *)0x700387,
                 (Bignum *)(CONCAT44(in_ESI,uVar1) & 0xffffffff01ffffff),in_RDI);
      shift_amount = (int)((ulong)in_stack_00000010 >> 0x20);
    }
  }
  else {
    InitialScaledStartValuesPositiveExponent
              (in_R9,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,need_boundary_deltas_00,
               in_stack_00000010,(Bignum *)0x700345,
               (Bignum *)(CONCAT44(in_ESI,uVar1) & 0xffffffff01ffffff),in_RDI);
    shift_amount = (int)((ulong)in_stack_00000010 >> 0x20);
  }
  if (((estimated_power_00 & 0x1000000) != 0) && ((uVar2 & 0x1000000) != 0)) {
    Bignum::ShiftLeft(numerator,shift_amount);
    Bignum::ShiftLeft(numerator,shift_amount);
    Bignum::ShiftLeft(numerator,shift_amount);
  }
  return;
}

Assistant:

static void InitialScaledStartValues(uint64_t significand,
                                     int exponent,
                                     bool lower_boundary_is_closer,
                                     int estimated_power,
                                     bool need_boundary_deltas,
                                     Bignum* numerator,
                                     Bignum* denominator,
                                     Bignum* delta_minus,
                                     Bignum* delta_plus) {
  if (exponent >= 0) {
    InitialScaledStartValuesPositiveExponent(
        significand, exponent, estimated_power, need_boundary_deltas,
        numerator, denominator, delta_minus, delta_plus);
  } else if (estimated_power >= 0) {
    InitialScaledStartValuesNegativeExponentPositivePower(
        significand, exponent, estimated_power, need_boundary_deltas,
        numerator, denominator, delta_minus, delta_plus);
  } else {
    InitialScaledStartValuesNegativeExponentNegativePower(
        significand, exponent, estimated_power, need_boundary_deltas,
        numerator, denominator, delta_minus, delta_plus);
  }

  if (need_boundary_deltas && lower_boundary_is_closer) {
    // The lower boundary is closer at half the distance of "normal" numbers.
    // Increase the common denominator and adapt all but the delta_minus.
    denominator->ShiftLeft(1);  // *2
    numerator->ShiftLeft(1);    // *2
    delta_plus->ShiftLeft(1);   // *2
  }
}